

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char ** cargo_split_commandline(cargo_splitcmd_flags_t flags,char *cmdline,int *argc)

{
  int iVar1;
  char **ptr;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char **p_00;
  wordexp_t p;
  
  if (argc == (int *)0x0) {
    __assert_fail("argc",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1ae1,
                  "char **cargo_split_commandline(cargo_splitcmd_flags_t, const char *, int *)");
  }
  if (cmdline != (char *)0x0) {
    p.we_wordc = 0;
    p.we_wordv = (char **)0x0;
    p.we_offs = 0;
    iVar1 = wordexp(cmdline,(wordexp_t *)&p,0);
    if (iVar1 != 0) {
      return (char **)0x0;
    }
    *argc = (int)p.we_wordc;
    ptr = (char **)_cargo_calloc((long)(int)p.we_wordc,8);
    if (ptr == (char **)0x0) {
      p.we_offs = 0;
      wordfree((wordexp_t *)&p);
    }
    else {
      uVar4 = 0;
      do {
        if (p.we_wordc <= uVar4) {
          p.we_offs = 0;
          wordfree((wordexp_t *)&p);
          return ptr;
        }
        pcVar2 = _cargo_strdup(p.we_wordv[uVar4]);
        ptr[uVar4] = pcVar2;
        uVar4 = uVar4 + 1;
      } while (pcVar2 != (char *)0x0);
      p.we_offs = 0;
      wordfree((wordexp_t *)&p);
      if (ptr != (char **)0x0) {
        p_00 = ptr;
        for (lVar3 = 0; lVar3 < *argc; lVar3 = lVar3 + 1) {
          _cargo_xfree(p_00);
          p_00 = p_00 + 1;
        }
        _cargo_free(ptr);
      }
    }
  }
  return (char **)0x0;
}

Assistant:

char **cargo_split_commandline(cargo_splitcmd_flags_t flags, const char *cmdline, int *argc)
{
    int i;
    char **argv = NULL;
    assert(argc);

    if (!cmdline)
    {
        CARGODBG(1, "Got NULL input\n");
        return NULL;
    }

    // Posix.
    #ifndef _WIN32
    {
        int ret;
        wordexp_t p;
        memset(&p, 0, sizeof(p));

        // Note! This expands shell variables.
        if ((ret = wordexp(cmdline, &p, 0)))
        {
            CARGODBG(1, "wordexp error %d: '%s'\n", ret, cmdline);
            return NULL;
        }

        *argc = p.we_wordc;

        if (!(argv = _cargo_calloc(*argc, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        for (i = 0; i < p.we_wordc; i++)
        {
            if (!(argv[i] = _cargo_strdup(p.we_wordv[i])))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }
        }

        // wordfree seems to fail to free everything in the wordexp_t struct
        // at least on OSX 10.9.5. This is supposed to help on 10.8.5 at least.
        p.we_offs = 0;
        wordfree(&p);

        return argv;
    fail:
        p.we_offs = 0;
        wordfree(&p);
    }
    #else // WIN32
    {
        // TODO: __getmainargs is an alternative... https://msdn.microsoft.com/en-us/library/ff770599.aspx
        wchar_t **wargs = NULL;
        size_t needed = 0;
        wchar_t *cmdlinew = NULL;
        size_t len = strlen(cmdline) + 1;

        if (!(cmdlinew = _cargo_calloc(len, sizeof(wchar_t))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        if (!MultiByteToWideChar(CP_ACP, 0, cmdline, -1, cmdlinew, len))
        {
            CARGODBG(1, "Failed to convert to unicode!\n");
            goto fail;
        }

        if (!(wargs = CommandLineToArgvW(cmdlinew, argc)))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        if (!(argv = _cargo_calloc(*argc, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        // Convert from wchar_t * to ANSI char *
        for (i = 0; i < *argc; i++)
        {
            // Get the size needed for the target buffer.
            // CP_ACP = Ansi Codepage.
            needed = WideCharToMultiByte(CP_ACP, 0, wargs[i], -1,
                                        NULL, 0, NULL, NULL);

            if (!(argv[i] = _cargo_malloc(needed)))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }

            // Do the conversion.
            needed = WideCharToMultiByte(CP_ACP, 0, wargs[i], -1,
                                        argv[i], needed, NULL, NULL);
        }

        if (wargs) LocalFree(wargs);
        _cargo_xfree(&cmdlinew);
        return argv;

    fail:
        if (wargs) LocalFree(wargs);
        _cargo_xfree(&cmdlinew);
    }
    #endif // WIN32

    if (argv)
    {
        for (i = 0; i < *argc; i++)
        {
            _cargo_xfree(&argv[i]);
        }

        _cargo_free(argv);
    }

    return NULL;
}